

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O2

void __thiscall
tetgenmesh::restorecavity
          (tetgenmesh *this,arraypool *crosstets,arraypool *topnewtets,arraypool *botnewtets,
          arraypool *missingshbds)

{
  uint *puVar1;
  tetrahedron *pppdVar2;
  int iVar3;
  int iVar4;
  char **ppcVar5;
  char *pcVar6;
  memorypool *pmVar7;
  uint uVar8;
  long lVar9;
  triface *t1;
  undefined8 *puVar10;
  long *plVar11;
  long lVar12;
  tetrahedron *pppdVar13;
  long lVar14;
  long *plVar15;
  triface neightet;
  
  neightet.tet = (tetrahedron *)0x0;
  neightet.ver = 0;
  plVar11 = &crosstets->objects;
  for (lVar14 = 0; lVar9 = *plVar11, lVar14 < lVar9; lVar14 = lVar14 + 1) {
    t1 = (triface *)
         (crosstets->toparray[(uint)lVar14 >> ((byte)crosstets->log2objectsperblock & 0x1f)] +
         (long)crosstets->objectbytes * (long)(int)(crosstets->objectsperblockmark & (uint)lVar14));
    uVar8 = 0;
    while (t1->ver = uVar8, (int)uVar8 < 4) {
      neightet.tet = (tetrahedron *)((ulong)t1->tet[uVar8 & 3] & 0xfffffffffffffff0);
      neightet.ver = fsymtbl[t1->ver][(uint)t1->tet[uVar8 & 3] & 0xf];
      if ((*(byte *)((long)neightet.tet + (long)this->elemmarkerindex * 4) & 1) == 0) {
        bond(this,t1,&neightet);
      }
      uVar8 = t1->ver + 1;
    }
    t1->ver = 0;
    pppdVar13 = t1->tet;
    iVar3 = this->point2simindex;
    for (lVar9 = 4; lVar9 != 8; lVar9 = lVar9 + 1) {
      pppdVar13[lVar9][iVar3] = (double *)pppdVar13;
    }
  }
  lVar14 = 0;
  if (lVar9 < 1) {
    lVar9 = lVar14;
  }
  ppcVar5 = crosstets->toparray;
  for (; lVar9 != lVar14; lVar14 = lVar14 + 1) {
    puVar1 = (uint *)(*(long *)(ppcVar5[(uint)lVar14 >>
                                        ((byte)crosstets->log2objectsperblock & 0x1f)] +
                               (long)crosstets->objectbytes *
                               (long)(int)(crosstets->objectsperblockmark & (uint)lVar14)) +
                     (long)this->elemmarkerindex * 4);
    *puVar1 = *puVar1 & 0xfffffffe;
  }
  pcVar6 = *ppcVar5;
  (this->recenttet).tet = *(tetrahedron **)pcVar6;
  (this->recenttet).ver = *(int *)(pcVar6 + 8);
  lVar9 = 0;
  lVar14 = missingshbds->objects;
  if (missingshbds->objects < 1) {
    lVar14 = lVar9;
  }
  iVar3 = this->shmarkindex;
  for (; lVar9 != lVar14; lVar9 = lVar9 + 1) {
    pcVar6 = missingshbds->toparray[(uint)lVar9 >> ((byte)missingshbds->log2objectsperblock & 0x1f)]
    ;
    lVar12 = (long)missingshbds->objectbytes *
             (long)(int)(missingshbds->objectsperblockmark & (uint)lVar9);
    iVar4 = *(int *)(pcVar6 + lVar12 + 8);
    puVar10 = (undefined8 *)
              (*(ulong *)(*(long *)(pcVar6 + lVar12) + 0x30 + (long)(iVar4 >> 1) * 8) &
              0xfffffffffffffff8);
    if ((puVar10[3] != 0) && ((*(byte *)((long)puVar10 + (long)iVar3 * 4 + 4) & 1) != 0)) {
      neightet.ver = (uint)puVar10[9] & 0xf;
      neightet.tet = (tetrahedron *)(puVar10[9] & 0xfffffffffffffff0);
      pppdVar13 = neightet.tet;
      uVar8 = neightet.ver;
      do {
        if (pppdVar13[8] != (tetrahedron)0x0) {
          pppdVar13[8][ver2edge[(int)uVar8]] = (double *)0x0;
        }
        pppdVar2 = pppdVar13 + facepivot1[(int)uVar8];
        pppdVar13 = (tetrahedron *)((ulong)*pppdVar2 & 0xfffffffffffffff0);
        uVar8 = facepivot2[(int)uVar8][(uint)*pppdVar2 & 0xf];
      } while (neightet.tet != pppdVar13);
      pmVar7 = this->subsegs;
      puVar10[3] = 0;
      *puVar10 = pmVar7->deaditemstack;
      pmVar7->deaditemstack = puVar10;
      pmVar7->items = pmVar7->items + -1;
      *(undefined8 *)(*(long *)(pcVar6 + lVar12) + 0x30 + (long)(iVar4 >> 1) * 8) = 0;
    }
  }
  plVar15 = &topnewtets->objects;
  for (lVar14 = 0; lVar14 < *plVar15; lVar14 = lVar14 + 1) {
    tetrahedrondealloc(this,*(tetrahedron **)
                             (topnewtets->toparray
                              [(uint)lVar14 >> ((byte)topnewtets->log2objectsperblock & 0x1f)] +
                             (long)topnewtets->objectbytes *
                             (long)(int)(topnewtets->objectsperblockmark & (uint)lVar14)));
  }
  if (botnewtets != (arraypool *)0x0) {
    for (lVar14 = 0; lVar14 < botnewtets->objects; lVar14 = lVar14 + 1) {
      tetrahedrondealloc(this,*(tetrahedron **)
                               (botnewtets->toparray
                                [(uint)lVar14 >> ((byte)botnewtets->log2objectsperblock & 0x1f)] +
                               (long)botnewtets->objectbytes *
                               (long)(int)(botnewtets->objectsperblockmark & (uint)lVar14)));
    }
    *plVar11 = 0;
    plVar11 = plVar15;
    plVar15 = &botnewtets->objects;
  }
  *plVar11 = 0;
  *plVar15 = 0;
  return;
}

Assistant:

void tetgenmesh::restorecavity(arraypool *crosstets, arraypool *topnewtets,
                               arraypool *botnewtets, arraypool *missingshbds)
{
  triface *parytet, neightet, spintet;
  face *parysh;
  face checkseg;
  point *ppt;
  int t1ver;
  int i, j;

  // Reconnect crossing tets to cavity boundary.
  for (i = 0; i < crosstets->objects; i++) {
    parytet = (triface *) fastlookup(crosstets, i);
    parytet->ver = 0;
    for (parytet->ver = 0; parytet->ver < 4; parytet->ver++) {
      fsym(*parytet, neightet);
      if (!infected(neightet)) {
        // Restore the old connections of tets.
        bond(*parytet, neightet);
      }
    }
    // Update the point-to-tet map.
    parytet->ver = 0;
    ppt = (point *) &(parytet->tet[4]);
    for (j = 0; j < 4; j++) {
      setpoint2tet(ppt[j], encode(*parytet));
    }
  }

  // Uninfect all crossing tets.
  for (i = 0; i < crosstets->objects; i++) {
    parytet = (triface *) fastlookup(crosstets, i);
    uninfect(*parytet);
  }

  // Remember a live handle.
  recenttet = * (triface *) fastlookup(crosstets, 0);

  // Delete faked segments.
  for (i = 0; i < missingshbds->objects; i++) {
    parysh = (face *) fastlookup(missingshbds, i);
    sspivot(*parysh, checkseg);
    if (checkseg.sh[3] != NULL) {
      if (sinfected(checkseg)) {
            // It's a faked segment. Delete it.
        sstpivot1(checkseg, neightet);
        spintet = neightet;
        while (1) {
          tssdissolve1(spintet);
          fnextself(spintet);
          if (spintet.tet == neightet.tet) break;
        }
        shellfacedealloc(subsegs, checkseg.sh);
        ssdissolve(*parysh);
        //checkseg.sh = NULL;
      }
    }
  } // i

  // Delete new tets.
  for (i = 0; i < topnewtets->objects; i++) {
    parytet = (triface *) fastlookup(topnewtets, i);
    tetrahedrondealloc(parytet->tet);
  }

  if (botnewtets != NULL) {
    for (i = 0; i < botnewtets->objects; i++) {
      parytet = (triface *) fastlookup(botnewtets, i);
      tetrahedrondealloc(parytet->tet);
    }
  }

  crosstets->restart();
  topnewtets->restart();
  if (botnewtets != NULL) {
    botnewtets->restart();
  }
}